

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-view.c
# Opt level: O1

_Bool los(chunk_conflict *c,loc_conflict grid1,loc_conflict grid2)

{
  _Bool _Var1;
  int iVar2;
  loc lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  
  iVar7 = grid2.y;
  iVar14 = grid1.y;
  uVar6 = iVar7 - iVar14;
  iVar11 = grid2.x;
  iVar15 = grid1.x;
  uVar9 = iVar11 - iVar15;
  uVar12 = -uVar6;
  if (0 < (int)uVar6) {
    uVar12 = uVar6;
  }
  uVar13 = -uVar9;
  if (0 < (int)uVar9) {
    uVar13 = uVar9;
  }
  bVar8 = true;
  if (1 < uVar13 || 1 < uVar12) {
    if (iVar11 == iVar15) {
      if ((int)uVar6 < 1) {
        do {
          iVar14 = iVar14 + -1;
          bVar8 = iVar14 <= iVar7;
          if (iVar14 <= iVar7) {
            return bVar8;
          }
          lVar3 = (loc)loc(iVar15,iVar14);
          _Var1 = square_isprojectable(c,lVar3);
        } while (_Var1);
      }
      else {
        do {
          iVar14 = iVar14 + 1;
          bVar8 = iVar7 <= iVar14;
          if (iVar7 <= iVar14) {
            return bVar8;
          }
          lVar3 = (loc)loc(iVar15,iVar14);
          _Var1 = square_isprojectable(c,lVar3);
        } while (_Var1);
      }
    }
    else if (iVar7 == iVar14) {
      if ((int)uVar9 < 1) {
        do {
          iVar15 = iVar15 + -1;
          bVar8 = iVar15 <= iVar11;
          if (iVar15 <= iVar11) {
            return bVar8;
          }
          lVar3 = (loc)loc(iVar15,iVar14);
          _Var1 = square_isprojectable(c,lVar3);
        } while (_Var1);
      }
      else {
        do {
          iVar15 = iVar15 + 1;
          bVar8 = iVar11 <= iVar15;
          if (iVar11 <= iVar15) {
            return bVar8;
          }
          lVar3 = (loc)loc(iVar15,iVar14);
          _Var1 = square_isprojectable(c,lVar3);
        } while (_Var1);
      }
    }
    else {
      uVar4 = (int)uVar6 >> 0x1f | 1;
      if (uVar12 == 2 && uVar13 == 1) {
        lVar3 = (loc)loc(iVar15,uVar4 + iVar14);
        _Var1 = square_isprojectable(c,lVar3);
        if (_Var1) {
          return true;
        }
      }
      uVar5 = (int)uVar9 >> 0x1f | 1;
      if (uVar13 == 2 && uVar12 == 1) {
        lVar3 = (loc)loc(uVar5 + iVar15,iVar14);
        _Var1 = square_isprojectable(c,lVar3);
        if (_Var1) {
          return true;
        }
      }
      iVar2 = uVar12 * uVar13;
      if (uVar13 < uVar12) {
        iVar14 = uVar4 + iVar14;
        if (iVar14 != iVar7) {
          iVar10 = uVar9 * uVar9;
          uVar12 = 0;
          iVar11 = 0;
          if (iVar10 == iVar2) {
            uVar12 = uVar5;
            iVar11 = iVar2 * 2;
          }
          iVar11 = iVar10 - iVar11;
          iVar15 = uVar12 + iVar15;
          do {
            lVar3 = (loc)loc(iVar15,iVar14);
            _Var1 = square_isprojectable(c,lVar3);
            if (!_Var1) {
              return false;
            }
            iVar11 = iVar11 + iVar10 * 2;
            if (iVar2 <= iVar11) {
              iVar15 = iVar15 + uVar5;
              if (iVar2 < iVar11) {
                lVar3 = (loc)loc(iVar15,iVar14);
                _Var1 = square_isprojectable(c,lVar3);
                if (!_Var1) {
                  return false;
                }
              }
              iVar11 = iVar11 + iVar2 * -2;
            }
            iVar14 = iVar14 + uVar4;
          } while (iVar7 != iVar14);
        }
      }
      else {
        iVar15 = iVar15 + uVar5;
        if (iVar15 != iVar11) {
          iVar10 = uVar6 * uVar6;
          iVar7 = 0;
          if (iVar10 == iVar2) {
            iVar7 = iVar2 * 2;
          }
          uVar12 = 0;
          if (iVar10 == iVar2) {
            uVar12 = uVar4;
          }
          iVar7 = iVar10 - iVar7;
          iVar14 = uVar12 + iVar14;
          do {
            lVar3 = (loc)loc(iVar15,iVar14);
            _Var1 = square_isprojectable(c,lVar3);
            if (!_Var1) {
              return false;
            }
            iVar7 = iVar7 + iVar10 * 2;
            if (iVar2 <= iVar7) {
              iVar14 = iVar14 + uVar4;
              if (iVar2 < iVar7) {
                lVar3 = (loc)loc(iVar15,iVar14);
                _Var1 = square_isprojectable(c,lVar3);
                if (!_Var1) {
                  return false;
                }
              }
              iVar7 = iVar7 + iVar2 * -2;
            }
            iVar15 = iVar15 + uVar5;
          } while (iVar11 != iVar15);
        }
      }
    }
  }
  return bVar8;
}

Assistant:

bool los(struct chunk *c, struct loc grid1, struct loc grid2)
{
	/* Delta */
	int dx, dy;

	/* Absolute */
	int ax, ay;

	/* Signs */
	int sx, sy;

	/* Fractions */
	int qx, qy;

	/* Scanners */
	int tx, ty;

	/* Scale factors */
	int f1, f2;

	/* Slope, or 1/Slope, of LOS */
	int m;

	/* Extract the offset */
	dy = grid2.y - grid1.y;
	dx = grid2.x - grid1.x;

	/* Extract the absolute offset */
	ay = ABS(dy);
	ax = ABS(dx);

	/* Handle adjacent (or identical) grids */
	if ((ax < 2) && (ay < 2)) return (true);

	/* Directly South/North */
	if (!dx) {
		/* South -- check for walls */
		if (dy > 0) {
			for (ty = grid1.y + 1; ty < grid2.y; ty++)
				if (!square_isprojectable(c, loc(grid1.x, ty))) return (false);
		} else { /* North -- check for walls */
			for (ty = grid1.y - 1; ty > grid2.y; ty--)
				if (!square_isprojectable(c, loc(grid1.x, ty))) return (false);
		}

		/* Assume los */
		return (true);
	}

	/* Directly East/West */
	if (!dy) {
		/* East -- check for walls */
		if (dx > 0) {
			for (tx = grid1.x + 1; tx < grid2.x; tx++)
				if (!square_isprojectable(c, loc(tx, grid1.y))) return (false);
		} else { /* West -- check for walls */
			for (tx = grid1.x - 1; tx > grid2.x; tx--)
				if (!square_isprojectable(c, loc(tx, grid1.y))) return (false);
		}

		/* Assume los */
		return (true);
	}


	/* Extract some signs */
	sx = (dx < 0) ? -1 : 1;
	sy = (dy < 0) ? -1 : 1;

	/* Vertical and horizontal "knights" */
	if ((ax == 1) && (ay == 2) &&
		square_isprojectable(c, loc(grid1.x, grid1.y + sy))) {
		return (true);
	} else if ((ay == 1) && (ax == 2) &&
			   square_isprojectable(c, loc(grid1.x + sx, grid1.y))) {
		return (true);
	}

	/* Calculate scale factor div 2 */
	f2 = (ax * ay);

	/* Calculate scale factor */
	f1 = f2 << 1;


	/* Travel horizontally */
	if (ax >= ay) {
		/* Let m = dy / dx * 2 * (dy * dx) = 2 * dy * dy */
		qy = ay * ay;
		m = qy << 1;

		tx = grid1.x + sx;

		/* Consider the special case where slope == 1. */
		if (qy == f2) {
			ty = grid1.y + sy;
			qy -= f1;
		} else {
			ty = grid1.y;
		}

		/* Note (below) the case (qy == f2), where */
		/* the LOS exactly meets the corner of a tile. */
		while (grid2.x - tx) {
			if (!square_isprojectable(c, loc(tx, ty)))
				return (false);

			qy += m;

			if (qy < f2) {
				tx += sx;
			} else if (qy > f2) {
				ty += sy;
				if (!square_isprojectable(c, loc(tx, ty)))
					return (false);
				qy -= f1;
				tx += sx;
			} else {
				ty += sy;
				qy -= f1;
				tx += sx;
			}
		}
	} else { /* Travel vertically */
		/* Let m = dx / dy * 2 * (dx * dy) = 2 * dx * dx */
		qx = ax * ax;
		m = qx << 1;

		ty = grid1.y + sy;

		if (qx == f2) {
			tx = grid1.x + sx;
			qx -= f1;
		} else {
			tx = grid1.x;
		}

		/* Note (below) the case (qx == f2), where */
		/* the LOS exactly meets the corner of a tile. */
		while (grid2.y - ty) {
			if (!square_isprojectable(c, loc(tx, ty)))
				return (false);

			qx += m;

			if (qx < f2) {
				ty += sy;
			} else if (qx > f2) {
				tx += sx;
				if (!square_isprojectable(c, loc(tx, ty)))
					return (false);
				qx -= f1;
				ty += sy;
			} else {
				tx += sx;
				qx -= f1;
				ty += sy;
			}
		}
	}

	/* Assume los */
	return (true);
}